

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O3

uint32 __thiscall
Js::RecyclableArgumentsArrayWalker::GetChildrenCount(RecyclableArgumentsArrayWalker *this)

{
  DynamicObject *this_00;
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  undefined4 *puVar5;
  ArenaAllocator *pAVar6;
  List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar7;
  DebuggerPropertyDisplayInfo *pDVar8;
  uint uVar9;
  ulong uVar10;
  Var local_38;
  Var itemObj;
  
  pLVar7 = (this->super_RecyclableArrayWalker).super_RecyclableObjectWalker.pMembersList;
  if (pLVar7 == (List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 *)0x0) {
    bVar2 = VarIs<Js::ArgumentsObject>
                      ((this->super_RecyclableArrayWalker).super_RecyclableObjectWalker.instance);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                  ,0xc1a,"(Js::VarIs<Js::ArgumentsObject>(instance))",
                                  "Js::VarIs<Js::ArgumentsObject>(instance)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
    this_00 = (DynamicObject *)
              (this->super_RecyclableArrayWalker).super_RecyclableObjectWalker.instance;
    pAVar6 = GetArenaFromContext((this->super_RecyclableArrayWalker).super_RecyclableObjectWalker.
                                 scriptContext);
    pLVar7 = (List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              *)new<Memory::ArenaAllocator>(0x30,pAVar6,0x364470);
    (pLVar7->
    super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>).
    alloc = pAVar6;
    (pLVar7->
    super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>).
    _vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_014e4370;
    (pLVar7->
    super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>).
    buffer = (Type)0x0;
    (pLVar7->
    super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>).
    count = 0;
    pLVar7->length = 0;
    pLVar7->increment = 4;
    (this->super_RecyclableArrayWalker).super_RecyclableObjectWalker.pMembersList = pLVar7;
    uVar3 = (*(this_00->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
              ._vptr_IRecyclerVisitedObject[0x6b])(this_00);
    bVar2 = DynamicObject::HasObjectArray(this_00);
    if ((this_00->field_1 != (anon_union_8_2_815e7e51_for_DynamicObject_2)0x0 && bVar2) &&
       (uVar9 = *(uint *)((long)this_00->field_1 + 0x20), uVar3 < uVar9)) {
      uVar3 = uVar9;
    }
    if (uVar3 != 0) {
      uVar10 = 0;
      do {
        iVar4 = (*(this_00->super_RecyclableObject).super_FinalizableObject.
                  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x26])
                          (this_00,this_00,uVar10,&local_38,
                           (this->super_RecyclableArrayWalker).super_RecyclableObjectWalker.
                           scriptContext);
        if (iVar4 == 1) {
          pAVar6 = GetArenaFromContext((this->super_RecyclableArrayWalker).
                                       super_RecyclableObjectWalker.scriptContext);
          pDVar8 = (DebuggerPropertyDisplayInfo *)new<Memory::ArenaAllocator>(0x18,pAVar6,0x364470);
          pDVar8->propId = (int)uVar10;
          pDVar8->aVar = local_38;
          pDVar8->flags = 0;
          pLVar7 = (this->super_RecyclableArrayWalker).super_RecyclableObjectWalker.pMembersList;
          JsUtil::
          List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          ::EnsureArray(pLVar7,0);
          iVar4 = (pLVar7->
                  super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>
                  ).count;
          (pLVar7->
          super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>
          ).buffer[iVar4] = pDVar8;
          (pLVar7->
          super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>
          ).count = iVar4 + 1;
        }
        uVar9 = (int)uVar10 + 1;
        uVar10 = (ulong)uVar9;
      } while (uVar3 != uVar9);
    }
    pLVar7 = (this->super_RecyclableArrayWalker).super_RecyclableObjectWalker.pMembersList;
    if (pLVar7 == (List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                   *)0x0) {
      return 0;
    }
  }
  return (pLVar7->
         super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>
         ).count;
}

Assistant:

uint32 RecyclableArgumentsArrayWalker::GetChildrenCount()
    {
        if (pMembersList == nullptr)
        {
            Assert(Js::VarIs<Js::ArgumentsObject>(instance));
            Js::ArgumentsObject * argObj = static_cast<Js::ArgumentsObject*>(instance);

            pMembersList = JsUtil::List<DebuggerPropertyDisplayInfo *, ArenaAllocator>::New(GetArenaFromContext(scriptContext));
            Assert(pMembersList);

            uint32 totalCount = argObj->GetNumberOfArguments();
            Js::ArrayObject * objectArray = argObj->GetObjectArray();
            if (objectArray != nullptr && objectArray->GetLength() > totalCount)
            {
                totalCount = objectArray->GetLength();
            }

            for (uint32 index = 0; index < totalCount; index++)
            {
                Var itemObj;
                if (argObj->GetItem(argObj, index, &itemObj, scriptContext))
                {
                    DebuggerPropertyDisplayInfo *info = Anew(GetArenaFromContext(scriptContext), DebuggerPropertyDisplayInfo, index, itemObj, DebuggerPropertyDisplayInfoFlags_None);
                    Assert(info);
                    pMembersList->Add(info);
                }
            }
       }

        return pMembersList ? pMembersList->Count() : 0;
    }